

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sm2.c
# Opt level: O0

int sm2_bn_asn1_encode(uint8_t *asn1,int *make,uint8_t *bn)

{
  int iVar1;
  byte *in_RDX;
  int *in_RSI;
  undefined1 *in_RDI;
  int len;
  int zeros;
  int ret;
  int local_20;
  int local_1c;
  byte *local_18;
  
  local_1c = 0;
  local_20 = 0;
  if (((in_RDI != (undefined1 *)0x0) && (in_RSI != (int *)0x0)) &&
     (local_18 = in_RDX, in_RDX != (byte *)0x0)) {
    for (; *local_18 == 0; local_18 = local_18 + 1) {
      local_20 = local_20 + 1;
    }
    iVar1 = (0x20 - local_20) + (uint)(0x7f < *local_18);
    if (-1 < iVar1) {
      *in_RDI = 2;
      in_RDI[1] = (char)iVar1;
      if (*local_18 < 0x80) {
        memcpy(in_RDI + 2,local_18,(long)iVar1);
      }
      else {
        in_RDI[2] = 0;
        memcpy(in_RDI + 3,local_18,(long)(iVar1 + -1));
      }
      *in_RSI = iVar1 + 2;
      local_1c = 1;
    }
  }
  return local_1c;
}

Assistant:

int sm2_bn_asn1_encode(uint8_t asn1[35], int *make, uint8_t bn[32])
{
    int ret = GML_ERROR;
    int zeros = 0;
    int len;

    if (asn1 == NULL || make == NULL || bn == NULL)
        goto end;

    while (*bn == 0) {
        zeros++;
        bn++;
    }

    len = 0x20 - zeros + (int)(bn[0] >= 0x80U); // bn is considered as negative if bn[0] >= 0x80
    if (len < 0)
        goto end;

    asn1[0] = 0x02U;
    asn1[1] = (uint8_t)len;
    asn1 += 2;
    if (bn[0] >= 0x80U) {
        *asn1 = 0x00U;
        asn1++;
        memcpy(asn1, bn, len - 1); // asn1 = 02 ?? bn
    }
    else {
        memcpy(asn1, bn, len); // asn1 = 02 ?? bn
    }
    *make = (len + 2);

    ret = GML_OK;
end:
    return ret;
}